

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O3

void Gia_ManMuxProfiling(Gia_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  int *piVar2;
  Gia_Obj_t *pGVar3;
  uint *puVar4;
  Abc_Nam_t *pAVar5;
  Vec_Wec_t *pVVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  Gia_Man_t *pGia;
  Mux_Man_t *p_00;
  Vec_Str_t *vStr;
  char *pcVar11;
  Vec_Int_t *pVVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  int fFound;
  timespec ts;
  int local_4c;
  timespec local_48;
  Vec_Str_t *local_38;
  
  iVar8 = clock_gettime(3,&local_48);
  if (iVar8 < 0) {
    lVar13 = 1;
  }
  else {
    lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar13 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  pGia = Gia_ManDupMuxes(p,2);
  uVar15 = pGia->nObjs;
  if (1 < uVar15) {
    uVar9 = uVar15 - 1;
    uVar15 = 0;
    do {
      uVar15 = uVar15 + 1;
      bVar7 = 9 < uVar9;
      uVar9 = uVar9 / 10;
    } while (bVar7);
  }
  p_00 = Mux_ManAlloc(pGia);
  Gia_ManLevelNum(pGia);
  Gia_ManCreateRefs(pGia);
  pVVar12 = pGia->vCos;
  if (0 < pVVar12->nSize) {
    piVar2 = pVVar12->pArray;
    lVar14 = 0;
    do {
      iVar8 = piVar2[lVar14];
      if (((long)iVar8 < 0) || (pGia->nObjs <= iVar8)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar3 = pGia->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar1 = pGVar3 + iVar8 + -(ulong)((uint)*(undefined8 *)(pGVar3 + iVar8) & 0x1fffffff);
      if ((pGVar1 < pGVar3) || (pGVar3 + (uint)pGia->nObjs <= pGVar1)) {
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      pGia->pRefs[(int)((ulong)((long)pGVar1 - (long)pGVar3) >> 2) * -0x55555555] =
           pGia->pRefs[(int)((ulong)((long)pGVar1 - (long)pGVar3) >> 2) * -0x55555555] + 1;
      lVar14 = lVar14 + 1;
    } while (lVar14 < pVVar12->nSize);
  }
  vStr = (Vec_Str_t *)malloc(0x10);
  vStr->nCap = 1000;
  vStr->nSize = 0;
  pcVar11 = (char *)malloc(1000);
  vStr->pArray = pcVar11;
  pVVar12 = Gia_ManFirstFanouts(pGia);
  if (0 < pGia->nObjs) {
    lVar14 = 0;
    local_38 = vStr;
    do {
      if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
      puVar4 = pGia->pMuxes;
      if ((puVar4 != (uint *)0x0) && (puVar4[lVar14] != 0)) {
        if (pGia->pRefs[lVar14] == 1) {
          if (pVVar12->nSize <= lVar14) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          if (puVar4[pVVar12->pArray[lVar14]] != 0) goto LAB_0072fc86;
        }
        iVar8 = Gia_MuxStructDump(pGia,(int)lVar14,vStr,3,uVar15);
        if (iVar8 != 1) {
          pAVar5 = p_00->pNames;
          uVar9 = Abc_NamStrFindOrAdd(pAVar5,vStr->pArray,&local_4c);
          if (local_4c == 0) {
            Vec_WecPushLevel(p_00->vTops);
          }
          iVar8 = Abc_NamObjNumMax(pAVar5);
          if (iVar8 != p_00->vTops->nSize) {
            __assert_fail("Abc_NamObjNumMax(pMan->pNames) == Vec_WecSize(pMan->vTops)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaMuxes.c"
                          ,0x224,"void Gia_ManMuxProfiling(Gia_Man_t *)");
          }
          if (((int)uVar9 < 0) || (iVar8 <= (int)uVar9)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                          ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
          }
          Vec_IntPush(p_00->vTops->pArray + uVar9,(int)lVar14);
          vStr = local_38;
        }
      }
LAB_0072fc86:
      lVar14 = lVar14 + 1;
    } while (lVar14 < pGia->nObjs);
  }
  if (vStr->pArray != (char *)0x0) {
    free(vStr->pArray);
  }
  free(vStr);
  if (pVVar12->pArray != (int *)0x0) {
    free(pVVar12->pArray);
  }
  free(pVVar12);
  uVar9 = 0;
  printf("MUX structure profile for AIG \"%s\":\n",p->pName);
  uVar15 = pGia->nMuxes;
  pVVar6 = p_00->vTops;
  iVar8 = pVVar6->nSize;
  if (0 < (long)iVar8) {
    lVar14 = 0;
    uVar9 = 0;
    do {
      uVar9 = uVar9 + *(int *)((long)&pVVar6->pArray->nSize + lVar14);
      lVar14 = lVar14 + 0x10;
    } while ((long)iVar8 << 4 != lVar14);
  }
  pAVar5 = p_00->pNames;
  iVar10 = Abc_NamMemUsed(pAVar5);
  printf("Total MUXes = %d.  Total trees = %d.  Unique trees = %d.  Memory = %.2f MB   ",
         (double)iVar10 * 9.5367431640625e-07,(ulong)uVar15,(ulong)uVar9,(ulong)(iVar8 - 1));
  iVar10 = 3;
  iVar8 = clock_gettime(3,&local_48);
  if (iVar8 < 0) {
    lVar14 = -1;
  }
  else {
    lVar14 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
  }
  Abc_Print(iVar10,"%s =","Time");
  Abc_Print(iVar10,"%9.2f sec\n",(double)(lVar14 + lVar13) / 1000000.0);
  iVar8 = Gia_ManMuxProfile(p_00,0);
  if (iVar8 != 0) {
    Gia_ManMuxProfile(p_00,1);
    printf("The first %d structures: \n",10);
    if (1 < pVVar6->nSize) {
      uVar16 = 1;
      lVar13 = 0x14;
      do {
        pVVar12 = pVVar6->pArray;
        pcVar11 = Abc_NamStr(pAVar5,(int)uVar16);
        printf("%5d : ",uVar16 & 0xffffffff);
        printf("Occur = %4d   ",(ulong)*(uint *)((long)&pVVar12->nCap + lVar13));
        uVar15 = atoi(pcVar11);
        printf("Size = %4d   ",(ulong)uVar15);
        puts(pcVar11);
        uVar16 = uVar16 + 1;
        iVar8 = pVVar6->nSize;
        iVar10 = 10;
        if (iVar8 < 10) {
          iVar10 = iVar8;
        }
        lVar13 = lVar13 + 0x10;
      } while ((long)uVar16 < (long)iVar10);
      if (1 < iVar8) {
        uVar16 = 1;
        iVar8 = 0;
        do {
          pVVar12 = pVVar6->pArray;
          pcVar11 = Abc_NamStr(pAVar5,(int)uVar16);
          uVar15 = pVVar12[uVar16].nSize;
          if (5 < (int)uVar15) {
            uVar9 = atoi(pcVar11);
            if (5 < (int)uVar9) {
              printf("For example, structure %d has %d MUXes and bit-width %d:\n",
                     uVar16 & 0xffffffff,(ulong)uVar9,(ulong)uVar15);
              if (0 < pVVar12[uVar16].nSize) {
                lVar13 = 0;
                do {
                  Gia_MuxStructPrint(pGia,pVVar12[uVar16].pArray[lVar13]);
                  lVar13 = lVar13 + 1;
                } while (lVar13 < pVVar12[uVar16].nSize);
              }
              iVar8 = iVar8 + 1;
              if (iVar8 == 5) break;
            }
          }
          uVar16 = uVar16 + 1;
        } while ((long)uVar16 < (long)pVVar6->nSize);
      }
    }
  }
  Mux_ManFree(p_00);
  Gia_ManStop(pGia);
  return;
}

Assistant:

void Gia_ManMuxProfiling( Gia_Man_t * p )
{
    Mux_Man_t * pMan;
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    Vec_Str_t * vStr;
    Vec_Int_t * vFans, * vVec;
    int i, Counter, fFound, iStructId, nDigitsId;
    abctime clk = Abc_Clock();

    pNew = Gia_ManDupMuxes( p, 2 );
    nDigitsId = Abc_Base10Log( Gia_ManObjNum(pNew) );

    pMan = Mux_ManAlloc( pNew );
     
    Gia_ManLevelNum( pNew );
    Gia_ManCreateRefs( pNew );
    Gia_ManForEachCo( pNew, pObj, i )
        Gia_ObjRefFanin0Inc( pNew, pObj );

    vStr = Vec_StrAlloc( 1000 );
    vFans = Gia_ManFirstFanouts( pNew );
    Gia_ManForEachMux( pNew, pObj, i )
    {
        // skip MUXes in the middle of the tree (which have only one MUX fanout)
        if ( Gia_ObjRefNumId(pNew, i) == 1 && Gia_ObjIsMuxId(pNew, Vec_IntEntry(vFans, i)) )
            continue;
        // this node is the root of the MUX structure - create hash key
        Counter = Gia_MuxStructDump( pNew, i, vStr, 3, nDigitsId );
        if ( Counter == 1 )
            continue;
        iStructId = Abc_NamStrFindOrAdd( pMan->pNames, Vec_StrArray(vStr), &fFound );
        if ( !fFound )
            Vec_WecPushLevel( pMan->vTops );
        assert( Abc_NamObjNumMax(pMan->pNames) == Vec_WecSize(pMan->vTops) );
        Vec_IntPush( Vec_WecEntry(pMan->vTops, iStructId), i );
    }
    Vec_StrFree( vStr );
    Vec_IntFree( vFans );

    printf( "MUX structure profile for AIG \"%s\":\n", p->pName );
    printf( "Total MUXes = %d.  Total trees = %d.  Unique trees = %d.  Memory = %.2f MB   ", 
        Gia_ManMuxNum(pNew), Vec_WecSizeSize(pMan->vTops), Vec_WecSize(pMan->vTops)-1, 
        1.0*Abc_NamMemUsed(pMan->pNames)/(1<<20) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    if ( Gia_ManMuxProfile(pMan, 0) )
    {
        Gia_ManMuxProfile( pMan, 1 );

        // short the first ones
        printf( "The first %d structures: \n", 10 );
        Vec_WecForEachLevelStartStop( pMan->vTops, vVec, i, 1, Abc_MinInt(Vec_WecSize(pMan->vTops), 10) )
        {
            char * pTemp = Abc_NamStr(pMan->pNames, i);
            printf( "%5d : ", i );
            printf( "Occur = %4d   ", Vec_IntSize(vVec) );
            printf( "Size = %4d   ", atoi(pTemp) );
            printf( "%s\n", pTemp );
        }

        // print trees for the first one
        Counter = 0;
        Vec_WecForEachLevelStart( pMan->vTops, vVec, i, 1 )
        {
            char * pTemp = Abc_NamStr(pMan->pNames, i);
            if ( Vec_IntSize(vVec) > 5 && atoi(pTemp) > 5 )
            {
                int k, Entry;
                printf( "For example, structure %d has %d MUXes and bit-width %d:\n", i, atoi(pTemp), Vec_IntSize(vVec) );
                Vec_IntForEachEntry( vVec, Entry, k )
                    Gia_MuxStructPrint( pNew, Entry );
                if ( ++Counter == 5 )
                    break;
            }
        }
    }

    Mux_ManFree( pMan );
    Gia_ManStop( pNew );
}